

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokFileDesc::~CTcTokFileDesc(CTcTokFileDesc *this)

{
  ulong uVar1;
  
  lib_free_str(this->fname_);
  lib_free_str(this->orig_fname_);
  free(this->dquoted_fname_);
  free(this->squoted_fname_);
  free(this->dquoted_rootname_);
  free(this->squoted_rootname_);
  if (this->src_pages_ != (CTcTokSrcPage **)0x0) {
    for (uVar1 = 0; uVar1 < this->src_pages_alo_; uVar1 = uVar1 + 1) {
      free(this->src_pages_[uVar1]);
    }
    free(this->src_pages_);
    return;
  }
  return;
}

Assistant:

CTcTokFileDesc::~CTcTokFileDesc()
{
    /* delete the filename and original filename strings */
    lib_free_str(fname_);
    lib_free_str(orig_fname_);

    /* delete the quotable filename strings */
    t3free(dquoted_fname_);
    t3free(squoted_fname_);
    t3free(dquoted_rootname_);
    t3free(squoted_rootname_);

    /* delete each source page we've allocated */
    if (src_pages_ != 0)
    {
        size_t i;

        /* go through the index array and delete each allocated page */
        for (i = 0 ; i < src_pages_alo_ ; ++i)
        {
            /* if this page was allocated, delete it */
            if (src_pages_[i] != 0)
                t3free(src_pages_[i]);
        }
        
        /* delete the source page index array */
        t3free(src_pages_);
    }
}